

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_ThrowGrenade
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  VMValue *pVVar1;
  AActor *this;
  int iVar2;
  uint uVar3;
  VMValue *pVVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double local_140;
  bool local_111;
  bool local_10e;
  bool local_10b;
  int u_4;
  int u_3;
  double z_vely;
  double z_velx;
  double z_velz;
  double z_xyscale;
  double xy_vely;
  double xy_velx;
  double xy_velz;
  double xy_xyscale;
  DAngle angle;
  DAngle pitch;
  DVector3 local_a8;
  AActor *local_90;
  AActor *bo;
  int u_2;
  int u_1;
  AWeapon *weapon;
  int u;
  bool useammo;
  double zvel;
  double xyvel;
  double zheight;
  MetaClass *missile;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  TArray<VMValue,_VMValue> *pTStack_20;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pTStack_20 = defaultparam;
  defaultparam_local = (TArray<VMValue,_VMValue> *)param;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xbb3,
                  "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar5 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar5 = true, (param->field_0).field_1.atag != 1)) {
    bVar5 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar5) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xbb3,
                  "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  stateowner = (AActor *)(param->field_0).field_1.a;
  local_10b = true;
  if (stateowner != (AActor *)0x0) {
    local_10b = DObject::IsKindOf((DObject *)stateowner,AActor::RegistrationInfo.MyClass);
  }
  if (local_10b == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xbb3,
                  "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  self._0_4_ = (int)self + 1;
  if (ret_local._4_4_ <= (int)self) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xbb3,
                  "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar5 = false;
  if (((char)defaultparam_local[(int)self].Count == '\x03') &&
     (bVar5 = true, defaultparam_local[(int)self].Most != 1)) {
    bVar5 = defaultparam_local[(int)self].Array == (VMValue *)0x0;
  }
  if (!bVar5) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xbb3,
                  "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  stateinfo = (FStateParamInfo *)defaultparam_local[(int)self].Array;
  local_10e = true;
  if ((DObject *)stateinfo != (DObject *)0x0) {
    local_10e = DObject::IsKindOf((DObject *)stateinfo,AActor::RegistrationInfo.MyClass);
  }
  if (local_10e == false) {
    __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xbb3,
                  "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  iVar2 = (int)self + 1;
  if (ret_local._4_4_ <= iVar2) {
    self._0_4_ = iVar2;
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xbb3,
                  "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if ((char)defaultparam_local[iVar2].Count != '\x03') {
    self._0_4_ = iVar2;
    __assert_fail("param[paramnum].Type == REGT_POINTER",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xbb3,
                  "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  missile = (MetaClass *)defaultparam_local[iVar2].Array;
  self._0_4_ = (int)self + 2;
  if (ret_local._4_4_ <= (int)self) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xbb4,
                  "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar5 = false;
  if (((char)defaultparam_local[(int)self].Count == '\x03') &&
     (bVar5 = true, defaultparam_local[(int)self].Most != 1)) {
    bVar5 = defaultparam_local[(int)self].Array == (VMValue *)0x0;
  }
  if (!bVar5) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xbb4,
                  "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  zheight = (double)defaultparam_local[(int)self].Array;
  local_111 = true;
  if ((PClass *)zheight != (PClass *)0x0) {
    local_111 = PClass::IsDescendantOf((PClass *)zheight,AActor::RegistrationInfo.MyClass);
  }
  if (local_111 == false) {
    __assert_fail("missile == NULL || missile->IsDescendantOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xbb4,
                  "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  self._0_4_ = (int)self + 1;
  if ((int)self < ret_local._4_4_) {
    if ((char)defaultparam_local[(int)self].Count != '\x01') {
      __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xbb5,
                    "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    xyvel = (double)defaultparam_local[(int)self].Array;
  }
  else {
    pVVar4 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
    if ((pVVar4->field_0).field_3.Type != '\x01') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xbb5,
                    "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pVVar4 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
    xyvel = (pVVar4->field_0).f;
  }
  self._0_4_ = (int)self + 1;
  if ((int)self < ret_local._4_4_) {
    if ((char)defaultparam_local[(int)self].Count != '\x01') {
      __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xbb6,
                    "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    zvel = (double)defaultparam_local[(int)self].Array;
  }
  else {
    pVVar4 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
    if ((pVVar4->field_0).field_3.Type != '\x01') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xbb6,
                    "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pVVar4 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
    zvel = (pVVar4->field_0).f;
  }
  self._0_4_ = (int)self + 1;
  if ((int)self < ret_local._4_4_) {
    if ((char)defaultparam_local[(int)self].Count != '\x01') {
      __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,2999,
                    "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    _u = defaultparam_local[(int)self].Array;
  }
  else {
    pVVar4 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
    if ((pVVar4->field_0).field_3.Type != '\x01') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,2999,
                    "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pVVar4 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
    _u = (VMValue *)(pVVar4->field_0).field_1.a;
  }
  self._0_4_ = (int)self + 1;
  if ((int)self < ret_local._4_4_) {
    if ((char)defaultparam_local[(int)self].Count != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,3000,
                    "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar2 = *(int *)&defaultparam_local[(int)self].Array;
  }
  else {
    pVVar4 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
    if ((pVVar4->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,3000,
                    "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pVVar4 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
    iVar2 = (pVVar4->field_0).i;
  }
  weapon._7_1_ = iVar2 != 0;
  if (zheight != 0.0) {
    if (((stateowner->player != (player_t *)0x0) && (missile != (MetaClass *)0x0)) &&
       (*(int *)((long)&(missile->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                        super_PCompoundType.super_PType.super_PTypeBase + 8) == 1)) {
      _u_2 = stateowner->player->ReadyWeapon;
      if (_u_2 == (AWeapon *)0x0) {
        bo._4_4_ = 1;
        if (self._4_4_ < 1) {
          return 0;
        }
        if (_paramnum != (VMReturn *)0x0) {
          VMReturn::SetInt(_paramnum,1);
          return 1;
        }
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0xbc5,
                      "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      if (((bool)weapon._7_1_) &&
         (bVar5 = AWeapon::DepleteAmmo(_u_2,(bool)(_u_2->bAltFire & 1),true,-1), !bVar5)) {
        bo._0_4_ = 1;
        if (self._4_4_ < 1) {
          return 0;
        }
        if (_paramnum != (VMReturn *)0x0) {
          VMReturn::SetInt(_paramnum,1);
          return 1;
        }
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0xbc9,
                      "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
    }
    this = stateowner;
    dVar7 = zheight;
    dVar8 = stateowner->Floorclip;
    dVar6 = AActor::GetBobOffset(stateowner,0.0);
    if (stateowner->player == (player_t *)0x0) {
      local_140 = 0.0;
    }
    else {
      local_140 = stateowner->player->crouchoffset;
    }
    AActor::PosPlusZ(&local_a8,this,-dVar8 + dVar6 + xyvel + 35.0 + local_140);
    local_90 = Spawn((PClassActor *)dVar7,&local_a8,ALLOW_REPLACE);
    if (local_90 == (AActor *)0x0) {
      if (self._4_4_ < 1) {
        param_local._4_4_ = 0;
      }
      else {
        if (_paramnum == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0xbf4,
                        "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        VMReturn::SetInt(_paramnum,0);
        param_local._4_4_ = 1;
      }
    }
    else {
      P_PlaySpawnSound(local_90,stateowner);
      if ((zvel != 0.0) || (NAN(zvel))) {
        local_90->Speed = zvel;
      }
      uVar3 = FRandom::operator()(&pr_grenade);
      TAngle<double>::operator+(&pitch,(double)(int)((uVar3 & 7) - 4) * 1.40625);
      TAngle<double>::operator=(&(local_90->Angles).Yaw,&pitch);
      TAngle<double>::operator-(&angle);
      TAngle<double>::TAngle((TAngle<double> *)&xy_xyscale,&(local_90->Angles).Yaw);
      dVar8 = local_90->Speed;
      dVar7 = TAngle<double>::Cos(&angle);
      dVar8 = dVar8 * dVar7;
      dVar7 = local_90->Speed;
      dVar6 = TAngle<double>::Sin(&angle);
      dVar9 = TAngle<double>::Cos((TAngle<double> *)&xy_xyscale);
      dVar10 = TAngle<double>::Sin((TAngle<double> *)&xy_xyscale);
      TAngle<double>::operator=(&angle,&(stateowner->Angles).Pitch);
      pVVar4 = _u;
      dVar11 = TAngle<double>::Sin(&angle);
      pVVar1 = _u;
      dVar12 = TAngle<double>::Cos(&angle);
      dVar13 = TAngle<double>::Cos((TAngle<double> *)&xy_xyscale);
      dVar14 = TAngle<double>::Sin((TAngle<double> *)&xy_xyscale);
      (local_90->Vel).X =
           dVar8 * dVar9 + (double)pVVar4 * dVar11 * dVar13 + (stateowner->Vel).X / 2.0;
      (local_90->Vel).Y =
           dVar8 * dVar10 + (double)pVVar4 * dVar11 * dVar14 + (stateowner->Vel).Y / 2.0;
      (local_90->Vel).Z = dVar7 * dVar6 + (double)pVVar1 * dVar12;
      TObjPtr<AActor>::operator=(&local_90->target,stateowner);
      P_CheckMissileSpawn(local_90,stateowner->radius);
      if (self._4_4_ < 1) {
        param_local._4_4_ = 0;
      }
      else {
        if (_paramnum == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0xbf6,
                        "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        VMReturn::SetInt(_paramnum,1);
        param_local._4_4_ = 1;
      }
    }
    return param_local._4_4_;
  }
  weapon._0_4_ = 1;
  if (self._4_4_ < 1) {
    return 0;
  }
  if (_paramnum != (VMReturn *)0x0) {
    VMReturn::SetInt(_paramnum,1);
    return 1;
  }
  __assert_fail("ret != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0xbbc,
                "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_ThrowGrenade)
{
		PARAM_ACTION_PROLOGUE(AActor);
	PARAM_CLASS		(missile, AActor);
		PARAM_FLOAT_DEF	(zheight)	
		PARAM_FLOAT_DEF	(xyvel)		
		PARAM_FLOAT_DEF	(zvel)		
		PARAM_BOOL_DEF	(useammo)	

	if (missile == NULL)
	{
		ACTION_RETURN_BOOL(true);
	}
	if (ACTION_CALL_FROM_PSPRITE())
	{
		// Used from a weapon, so use some ammo
		AWeapon *weapon = self->player->ReadyWeapon;

		if (weapon == NULL)
		{
			ACTION_RETURN_BOOL(true);
		}
		if (useammo && !weapon->DepleteAmmo(weapon->bAltFire))
		{
			ACTION_RETURN_BOOL(true);
		}
	}

	AActor *bo;

	bo = Spawn(missile, 
			self->PosPlusZ(-self->Floorclip + self->GetBobOffset() + zheight + 35 + (self->player? self->player->crouchoffset : 0.)),
			ALLOW_REPLACE);
	if (bo)
	{
		P_PlaySpawnSound(bo, self);
		if (xyvel != 0)
			bo->Speed = xyvel;
		bo->Angles.Yaw = self->Angles.Yaw + (((pr_grenade()&7) - 4) * (360./256.));

		DAngle pitch = -self->Angles.Pitch;
		DAngle angle = bo->Angles.Yaw;

		// There are two vectors we are concerned about here: xy and z. We rotate
		// them separately according to the shooter's pitch and then sum them to
		// get the final velocity vector to shoot with.

		double xy_xyscale = bo->Speed * pitch.Cos();
		double xy_velz = bo->Speed * pitch.Sin();
		double xy_velx = xy_xyscale * angle.Cos();
		double xy_vely = xy_xyscale * angle.Sin();

		pitch = self->Angles.Pitch;
		double z_xyscale = zvel * pitch.Sin();
		double z_velz = zvel * pitch.Cos();
		double z_velx = z_xyscale * angle.Cos();
		double z_vely = z_xyscale * angle.Sin();

		bo->Vel.X = xy_velx + z_velx + self->Vel.X / 2;
		bo->Vel.Y = xy_vely + z_vely + self->Vel.Y / 2;
		bo->Vel.Z = xy_velz + z_velz;

		bo->target = self;
		P_CheckMissileSpawn (bo, self->radius);
	} 
	else
	{
		ACTION_RETURN_BOOL(false);
	}
	ACTION_RETURN_BOOL(true);
}